

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O1

void __thiscall RString::ToLowerCase(RString *this)

{
  byte *pbVar1;
  byte bVar2;
  long lVar3;
  
  if ((this->myString != (char *)0x0) && ('\0' < this->myString[-1])) {
    CloneString(this);
  }
  pbVar1 = (byte *)this->myString;
  bVar2 = *pbVar1;
  if (bVar2 != 0) {
    lVar3 = 1;
    do {
      if ((byte)(bVar2 + 0xbf) < 0x1a) {
        *pbVar1 = bVar2 | 0x20;
      }
      bVar2 = this->myString[lVar3];
      pbVar1 = (byte *)(this->myString + lVar3);
      lVar3 = lVar3 + 1;
    } while (bVar2 != 0);
  }
  return;
}

Assistant:

void RString::ToLowerCase(void)
{
	PrepForMod();

	for(int i = 0; *(myString + i) != '\0'; i++)
		if(*(myString + i) >= 'A' && *(myString + i) <= 'Z')
			*(myString + i) += 'a' - 'A';
}